

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O0

size_t __thiscall ON_SubDHeap::SizeOf(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sz;
  ON_SubDHeap *this_local;
  
  sVar1 = SizeOfAllPools(this);
  sVar2 = ON_FixedSizePool::ActiveElementCount(&this->m_fspv);
  sVar3 = ON_FixedSizePool::ActiveElementCount(&this->m_fspe);
  sVar4 = ON_FixedSizePool::ActiveElementCount(&this->m_fspf);
  return (sVar2 + sVar3 + sVar4) * 8 + sVar1 + 0x348;
}

Assistant:

size_t SizeOf() const
  {
    size_t sz = sizeof(*this);

    sz += SizeOfAllPools();

    // For vertices with multiple sectors and multiple limit points,
    // additional limit points come from a global limit point pool.
    // In any given subd, this is a small minority of vertices and
    // this undercounting of memory is a tiny compared with the
    // pool sizes counted above.

    // For vertices with more than 17 faces or more than 17 edges,
    // the ON_SubDVertex.m_faces[] and ON_SubDVertex.m_edges[] arrays
    // are individually allocated. This is not common and the undercount
    // is tiny compared with the pool sizes counted above.

    // For non-manifold edges with more than 17 faces,
    // the ON_SubDEdge.m_faces[] array is individually allocated. 
    // This is extremely uncommon and the undercount
    // is tiny compared with the pool sizes counted above.

    // For faces with more than 17 edges,
    // the ON_SubDFace.m_edges[] array is individually allocated. 
    // This is uncommon and the undercount
    // is tiny compared with the pool sizes counted above.

    // Add this fudge factor typically more than accounts for 
    // the uncommon and minimal undercounts that are described above.
    sz += 8 * (m_fspv.ActiveElementCount() + m_fspe.ActiveElementCount() + m_fspf.ActiveElementCount());

    return sz;
  }